

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_vers_test(void)

{
  type_t tVar1;
  int iVar2;
  long *plVar3;
  value_type vVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *pvVar7;
  pointer *local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a8;
  type_t val2;
  type_t val1;
  size_t j;
  int i;
  type_t *ptrval;
  value_type_conflict vStack_170;
  matras_id_t tmp;
  long local_168;
  type_t mod;
  size_t p;
  uint local_150;
  int del_ver;
  matras_id_t new_ver;
  int iStack_144;
  bool add_ver;
  int k;
  int s;
  type_t val;
  undefined1 local_128 [8];
  matras local;
  int cur_num_or_ver;
  int use_mask;
  vector<unsigned_long,_std::allocator<unsigned_long>_> comps [8];
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","matras_vers_test");
  local_1a8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cur_num_or_ver;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_1a8);
    local_1a8 = local_1a8 + 1;
  } while (local_1a8 !=
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  local.stats._4_4_ = 1;
  local.stats._0_4_ = 1;
  extents_in_use = 0;
  matras_create((matras *)local_128,8,&ver_allocator,(matras_stats *)0x0);
  _k = 0;
  iStack_144 = 10;
  do {
    if (7999 < iStack_144) {
      matras_destroy((matras *)local_128);
      _ok((uint)(extents_in_use == 0),"extents_in_use == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0xff,
          "line %d");
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_vers_test");
      check_plan();
      local_208 = &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        local_208 = local_208 + -3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
      } while (local_208 != (pointer *)&cur_num_or_ver);
      return;
    }
    for (new_ver = 0; (int)new_ver < 800; new_ver = new_ver + 1) {
      iVar2 = rand();
      if (iVar2 % 0x10 == 0) {
        if ((int)local.stats == 1) {
          del_ver._3_1_ = true;
        }
        else if ((int)local.stats == 8) {
          del_ver._3_1_ = false;
        }
        else {
          iVar2 = rand();
          del_ver._3_1_ = iVar2 % 2 == 0;
        }
        if ((bool)del_ver._3_1_ == false) {
          local.stats._0_4_ = (int)local.stats + -1;
          do {
            iVar2 = rand();
            p._4_4_ = iVar2 % 7 + 1;
          } while ((local.stats._4_4_ & 1 << ((byte)p._4_4_ & 0x1f)) == 0);
          matras_destroy_read_view((matras *)local_128,views + p._4_4_);
          unreg_view_id(p._4_4_);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (&cur_num_or_ver + (long)p._4_4_ * 6));
          local.stats._4_4_ = (1 << ((byte)p._4_4_ & 0x1f) ^ 0xffffffffU) & local.stats._4_4_;
        }
        else {
          local.stats._0_4_ = (int)local.stats + 1;
          local_150 = reg_view_id();
          matras_create_read_view((matras *)local_128,views + local_150);
          if (local_150 == 0) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","new_ver > 0",
                    "false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                    ,0xcf,"matras_vers_test");
            exit(-1);
          }
          local.stats._4_4_ = local.stats._4_4_ | 1 << (local_150 & 0x1f);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (&cur_num_or_ver + (ulong)local_150 * 6),
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cur_num_or_ver);
        }
      }
      else {
        iVar2 = rand();
        if ((iVar2 % 8 == 0) &&
           (sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &cur_num_or_ver), sVar5 != 0)) {
          matras_dealloc((matras *)local_128);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cur_num_or_ver);
        }
        iVar2 = rand();
        mod = (type_t)(iVar2 % iStack_144);
        local_168 = 0;
        while (tVar1 = mod,
              sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &cur_num_or_ver), sVar5 <= tVar1) {
          vStack_170 = _k * 10000 + local_168;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cur_num_or_ver,
                     &stack0xfffffffffffffe90);
          plVar3 = (long *)matras_alloc((matras *)local_128,(matras_id_t *)((long)&ptrval + 4));
          *plVar3 = _k * 10000 + local_168;
          local_168 = local_168 + 1;
        }
        vVar4 = _k + 1;
        _k = vVar4;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&cur_num_or_ver
                            ,mod);
        *pvVar6 = vVar4;
        matras_touch((matras *)local_128,(matras_id_t)mod);
        vVar4 = _k;
        pvVar7 = (value_type *)matras_get((matras *)local_128,(matras_id_t)mod);
        *pvVar7 = vVar4;
      }
      views[0].root = (void *)local_128;
      views[0].block_count = (size_t)local.head.root;
      views[0].prev_view = (matras_view *)local.head.block_count;
      views[0].next_view = local.head.prev_view;
      for (j._4_4_ = 0; j._4_4_ < 8; j._4_4_ = j._4_4_ + 1) {
        if ((local.stats._4_4_ & 1 << ((byte)j._4_4_ & 0x1f)) != 0) {
          sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (&cur_num_or_ver + (long)j._4_4_ * 6));
          if (sVar5 != views[j._4_4_].block_count) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                    "comps[i].size() == views[i].block_count","false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                    ,0xf5,"matras_vers_test");
            exit(-1);
          }
          for (val1 = 0;
              sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 (&cur_num_or_ver + (long)j._4_4_ * 6)), val1 < sVar5;
              val1 = val1 + 1) {
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (&cur_num_or_ver + (long)j._4_4_ * 6),val1);
            vVar4 = *pvVar6;
            pvVar7 = (value_type *)
                     matras_view_get((matras *)local_128,views + j._4_4_,(matras_id_t)val1);
            if (vVar4 != *pvVar7) {
              fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","val1 == val2",
                      "false",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                      ,0xf9,"matras_vers_test");
              exit(-1);
            }
          }
        }
      }
    }
    iStack_144 = (int)((double)iStack_144 * 1.5);
  } while( true );
}

Assistant:

void
matras_vers_test()
{
	plan(1);
	header();

	std::vector<type_t> comps[MATRAS_VERSION_COUNT];
	int use_mask = 1;
	int cur_num_or_ver = 1;
	struct matras local;
	extents_in_use = 0;
	matras_create(&local, sizeof(type_t), &ver_allocator, NULL);
	type_t val = 0;
	for (int s = 10; s < 8000; s = int(s * 1.5)) {
		for (int k = 0; k < 800; k++) {
			if (rand() % 16 == 0) {
				bool add_ver;
				if (cur_num_or_ver == 1)
					add_ver = true;
				else if (cur_num_or_ver == MATRAS_VERSION_COUNT)
					add_ver = false;
				else
					add_ver = rand() % 2 == 0;
				if (add_ver) {
					cur_num_or_ver++;
					matras_id_t new_ver = reg_view_id();
					matras_create_read_view(&local, views + new_ver);
					fail_unless(new_ver > 0);
					use_mask |= (1 << new_ver);
					comps[new_ver] = comps[0];
				} else {
					cur_num_or_ver--;
					int del_ver;
					do {
						del_ver = 1 + rand() % (MATRAS_VERSION_COUNT - 1);
					} while ((use_mask & (1 << del_ver)) == 0);
					matras_destroy_read_view(&local, views + del_ver);
					unreg_view_id(del_ver);
					comps[del_ver].clear();
					use_mask &= ~(1 << del_ver);
				}
			} else {
				if (rand() % 8 == 0 && comps[0].size() > 0) {
					matras_dealloc(&local);
					comps[0].pop_back();
				}
				size_t p = rand() % s;
				type_t mod = 0;
				while (p >= comps[0].size()) {
					comps[0].push_back(val * 10000 + mod);
					matras_id_t tmp;
					type_t *ptrval = (type_t *)matras_alloc(&local, &tmp);
					*ptrval = val * 10000 + mod;
					mod++;
				}
				val++;
				comps[0][p] = val;
				matras_touch(&local, p);
				*(type_t *)matras_get(&local, p) = val;
			}
			views[0] = local.head;

			for (int i = 0; i < MATRAS_VERSION_COUNT; i++) {
				if ((use_mask & (1 << i)) == 0)
					continue;
				fail_unless(comps[i].size() == views[i].block_count);
				for (size_t j = 0; j < comps[i].size(); j++) {
					type_t val1 = comps[i][j];
					type_t val2 = *(type_t *)matras_view_get(&local, views + i, j);
					fail_unless(val1 == val2);
				}
			}
		}
	}
	matras_destroy(&local);
	ok(extents_in_use == 0);

	footer();
	check_plan();
}